

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

StreamingListener * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_(StreamingListener *this,char *str)

{
  int iVar1;
  String local_60;
  String local_50 [2];
  byte local_2d;
  char ch;
  undefined1 local_19;
  byte *local_18;
  char *str_local;
  string *result;
  
  local_19 = 0;
  local_18 = (byte *)str;
  str_local = (char *)this;
  std::__cxx11::string::string((string *)this);
  strlen((char *)local_18);
  std::__cxx11::string::reserve((ulong)this);
  local_2d = *local_18;
  while (local_2d != 0) {
    iVar1 = (int)(char)local_2d;
    if (((iVar1 == 10) || (iVar1 - 0x25U < 2)) || (iVar1 == 0x3d)) {
      String::Format(&local_60,"%%%02x",(ulong)local_2d);
      String::operator_cast_to_string(local_50);
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)local_50);
      String::~String(&local_60);
    }
    else {
      std::__cxx11::string::push_back((char)this);
    }
    local_2d = local_18[1];
    local_18 = local_18 + 1;
  }
  return this;
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append(String::Format("%%%02x", static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}